

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldCex.c
# Opt level: O3

void Saig_ManCbaFindReason_rec(Aig_Man_t *p,Aig_Obj_t *pObj,Vec_Int_t *vPrios,Vec_Int_t *vReasons)

{
  Aig_Obj_t *pAVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t **ppAVar7;
  Aig_Obj_t *pAVar8;
  uint uVar9;
  Aig_Obj_t *pAVar10;
  
  iVar3 = p->nTravIds;
  if (pObj->TravId != iVar3) {
    do {
      pObj->TravId = iVar3;
      if (((ulong)pObj & 1) != 0) {
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                      ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
      }
      uVar2 = (uint)*(ulong *)&pObj->field_0x18;
      uVar5 = uVar2 & 7;
      if (uVar5 == 1) {
        return;
      }
      if (uVar5 == 2) {
        Vec_IntPush(vReasons,(pObj->field_0).CioId);
        return;
      }
      if ((uVar2 & 7) - 7 < 0xfffffffe) {
        __assert_fail("Aig_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absOldCex.c"
                      ,0x111,
                      "void Saig_ManCbaFindReason_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      pAVar1 = pObj->pFanin0;
      if ((*(ulong *)&pObj->field_0x18 & 8) == 0) {
        uVar2 = (uint)pAVar1 & 1;
        pAVar6 = (Aig_Obj_t *)((ulong)pAVar1 & 0xfffffffffffffffe);
        uVar5 = *(uint *)&pAVar6->field_0x18 >> 3 & 1;
        pAVar8 = (Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
        uVar9 = (*(uint *)&pAVar8->field_0x18 >> 3 ^ (uint)pObj->pFanin1) & 1;
        if ((uVar2 != uVar5) && (uVar9 != 0)) {
          __assert_fail("!fPhase0 || !fPhase1",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absOldCex.c"
                        ,0x11b,
                        "void Saig_ManCbaFindReason_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Int_t *, Vec_Int_t *)"
                       );
        }
        if (((uVar2 != uVar5) || (pAVar10 = pAVar6, uVar9 == 0)) &&
           ((uVar2 == uVar5 || (pAVar10 = pAVar8, uVar9 != 0)))) {
          iVar4 = -1;
          iVar3 = -1;
          if (pAVar1 != (Aig_Obj_t *)0x0) {
            iVar3 = pAVar6->Id;
          }
          ppAVar7 = &pObj->pFanin1;
          iVar3 = Vec_IntEntry(vPrios,iVar3);
          if (*ppAVar7 != (Aig_Obj_t *)0x0) {
            iVar4 = *(int *)(((ulong)*ppAVar7 & 0xfffffffffffffffe) + 0x24);
          }
          iVar4 = Vec_IntEntry(vPrios,iVar4);
          if (iVar3 <= iVar4) {
            ppAVar7 = &pObj->pFanin0;
          }
          goto LAB_00591da7;
        }
      }
      else {
        Saig_ManCbaFindReason_rec
                  (p,(Aig_Obj_t *)((ulong)pAVar1 & 0xfffffffffffffffe),vPrios,vReasons);
        ppAVar7 = &pObj->pFanin1;
LAB_00591da7:
        pAVar10 = (Aig_Obj_t *)((ulong)*ppAVar7 & 0xfffffffffffffffe);
      }
      iVar3 = p->nTravIds;
      pObj = pAVar10;
    } while (pAVar10->TravId != iVar3);
  }
  return;
}

Assistant:

void Saig_ManCbaFindReason_rec( Aig_Man_t * p, Aig_Obj_t * pObj, Vec_Int_t * vPrios, Vec_Int_t * vReasons )
{
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(p, pObj);
    if ( Aig_ObjIsConst1(pObj) )
        return;
    if ( Aig_ObjIsCi(pObj) )
    {
        Vec_IntPush( vReasons, Aig_ObjCioId(pObj) );
        return;
    }
    assert( Aig_ObjIsNode(pObj) );
    if ( pObj->fPhase )
    {
        Saig_ManCbaFindReason_rec( p, Aig_ObjFanin0(pObj), vPrios, vReasons );
        Saig_ManCbaFindReason_rec( p, Aig_ObjFanin1(pObj), vPrios, vReasons );
    }
    else
    {
        int fPhase0 = Aig_ObjFaninC0(pObj) ^ Aig_ObjFanin0(pObj)->fPhase;
        int fPhase1 = Aig_ObjFaninC1(pObj) ^ Aig_ObjFanin1(pObj)->fPhase;
        assert( !fPhase0 || !fPhase1 );
        if ( !fPhase0 && fPhase1 )
            Saig_ManCbaFindReason_rec( p, Aig_ObjFanin0(pObj), vPrios, vReasons );
        else if ( fPhase0 && !fPhase1 )
            Saig_ManCbaFindReason_rec( p, Aig_ObjFanin1(pObj), vPrios, vReasons );
        else 
        {
            int iPrio0 = Vec_IntEntry( vPrios, Aig_ObjFaninId0(pObj) );
            int iPrio1 = Vec_IntEntry( vPrios, Aig_ObjFaninId1(pObj) );
            if ( iPrio0 <= iPrio1 )
                Saig_ManCbaFindReason_rec( p, Aig_ObjFanin0(pObj), vPrios, vReasons );
            else
                Saig_ManCbaFindReason_rec( p, Aig_ObjFanin1(pObj), vPrios, vReasons );
        }
    }
}